

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StackTraceGnu-inl.cpp
# Opt level: O0

BackTraceSymbol * __thiscall
cppassert::internal::BackTraceSymbol::operator=(BackTraceSymbol *this,BackTraceSymbol *other)

{
  BackTraceSymbol *other_local;
  BackTraceSymbol *this_local;
  
  deallocate(this);
  this->allocated_ = other->allocated_;
  this->symbol_ = other->symbol_;
  other->allocated_ = (char *)0x0;
  other->symbol_ = (char *)0x0;
  return this;
}

Assistant:

BackTraceSymbol &operator=(BackTraceSymbol &&other)
    {
        deallocate();
        allocated_ = other.allocated_;
        symbol_ = other.symbol_;
        other.allocated_ = nullptr;
        other.symbol_ = nullptr;
        return (*this);
    }